

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  float fVar39;
  float fVar45;
  float fVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar79;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  float fVar88;
  undefined1 auVar89 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar90 [64];
  undefined1 auVar94 [16];
  uint uVar96;
  uint uVar97;
  uint uVar98;
  undefined1 auVar95 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  float fVar102;
  float fVar108;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  undefined1 auVar105 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_a28;
  undefined8 uStack_a20;
  int local_a0c;
  undefined1 local_a08 [16];
  RTCIntersectArguments *local_9f0;
  long local_9e8;
  RayQueryContext *local_9e0;
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  long local_9b0;
  long local_9a8;
  long local_9a0;
  ulong local_998;
  ulong *local_990;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  uint local_970;
  uint local_96c;
  uint local_968;
  RTCFilterFunctionNArguments local_958;
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar39 = ray->tfar;
    if (0.0 <= fVar39) {
      local_9e0 = context;
      local_990 = local_7d0;
      aVar4 = (ray->dir).field_0;
      auVar48 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar41._8_4_ = 0x7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar41._12_4_ = 0x7fffffff;
      auVar41 = vandps_avx((undefined1  [16])aVar4,auVar41);
      auVar80._8_4_ = 0x219392ef;
      auVar80._0_8_ = 0x219392ef219392ef;
      auVar80._12_4_ = 0x219392ef;
      auVar41 = vcmpps_avx(auVar41,auVar80,1);
      auVar41 = vblendvps_avx((undefined1  [16])aVar4,auVar80,auVar41);
      auVar80 = vrcpps_avx(auVar41);
      fVar45 = auVar80._0_4_;
      auVar70._0_4_ = fVar45 * auVar41._0_4_;
      fVar46 = auVar80._4_4_;
      auVar70._4_4_ = fVar46 * auVar41._4_4_;
      fVar47 = auVar80._8_4_;
      auVar70._8_4_ = fVar47 * auVar41._8_4_;
      fVar79 = auVar80._12_4_;
      auVar70._12_4_ = fVar79 * auVar41._12_4_;
      auVar81._8_4_ = 0x3f800000;
      auVar81._0_8_ = 0x3f8000003f800000;
      auVar81._12_4_ = 0x3f800000;
      auVar41 = vsubps_avx(auVar81,auVar70);
      auVar71._0_4_ = fVar45 + fVar45 * auVar41._0_4_;
      auVar71._4_4_ = fVar46 + fVar46 * auVar41._4_4_;
      auVar71._8_4_ = fVar47 + fVar47 * auVar41._8_4_;
      auVar71._12_4_ = fVar79 + fVar79 * auVar41._12_4_;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_8a8._4_4_ = uVar3;
      local_8a8._0_4_ = uVar3;
      local_8a8._8_4_ = uVar3;
      local_8a8._12_4_ = uVar3;
      auVar85 = ZEXT1664(local_8a8);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_8b8._4_4_ = uVar3;
      local_8b8._0_4_ = uVar3;
      local_8b8._8_4_ = uVar3;
      local_8b8._12_4_ = uVar3;
      auVar87 = ZEXT1664(local_8b8);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_8c8._4_4_ = uVar3;
      local_8c8._0_4_ = uVar3;
      local_8c8._8_4_ = uVar3;
      local_8c8._12_4_ = uVar3;
      auVar90 = ZEXT1664(local_8c8);
      local_8d8 = vshufps_avx(auVar71,auVar71,0);
      auVar95 = ZEXT1664(local_8d8);
      auVar41 = vmovshdup_avx(auVar71);
      local_8e8 = vshufps_avx(auVar71,auVar71,0x55);
      auVar100 = ZEXT1664(local_8e8);
      auVar80 = vshufpd_avx(auVar71,auVar71,1);
      local_8f8 = vshufps_avx(auVar71,auVar71,0xaa);
      auVar101 = ZEXT1664(local_8f8);
      local_998 = (ulong)(auVar71._0_4_ < 0.0) << 4;
      uVar36 = (ulong)(auVar41._0_4_ < 0.0) << 4 | 0x20;
      uVar35 = (ulong)(auVar80._0_4_ < 0.0) << 4 | 0x40;
      uVar37 = local_998 ^ 0x10;
      local_908 = vshufps_avx(auVar48,auVar48,0);
      auVar83 = ZEXT1664(local_908);
      local_918 = vshufps_avx(ZEXT416((uint)fVar39),ZEXT416((uint)fVar39),0);
      auVar105 = ZEXT1664(local_918);
      local_928 = mm_lookupmask_ps._240_16_;
LAB_002c03d8:
      do {
        uVar38 = local_990[-1];
        local_990 = local_990 + -1;
        while ((uVar38 & 8) == 0) {
          uVar31 = uVar38 & 0xfffffffffffffff0;
          fVar39 = (ray->dir).field_0.m128[3];
          auVar40._4_4_ = fVar39;
          auVar40._0_4_ = fVar39;
          auVar40._8_4_ = fVar39;
          auVar40._12_4_ = fVar39;
          pfVar2 = (float *)(uVar31 + 0x80 + local_998);
          pfVar1 = (float *)(uVar31 + 0x20 + local_998);
          auVar48._0_4_ = fVar39 * *pfVar2 + *pfVar1;
          auVar48._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
          auVar48._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
          auVar48._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
          auVar41 = vsubps_avx(auVar48,auVar85._0_16_);
          auVar49._0_4_ = auVar95._0_4_ * auVar41._0_4_;
          auVar49._4_4_ = auVar95._4_4_ * auVar41._4_4_;
          auVar49._8_4_ = auVar95._8_4_ * auVar41._8_4_;
          auVar49._12_4_ = auVar95._12_4_ * auVar41._12_4_;
          pfVar2 = (float *)(uVar31 + 0x80 + uVar36);
          auVar41 = vmaxps_avx(auVar83._0_16_,auVar49);
          pfVar1 = (float *)(uVar31 + 0x20 + uVar36);
          auVar60._0_4_ = fVar39 * *pfVar2 + *pfVar1;
          auVar60._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
          auVar60._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
          auVar60._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
          auVar48 = vsubps_avx(auVar60,auVar87._0_16_);
          pfVar2 = (float *)(uVar31 + 0x80 + uVar35);
          pfVar1 = (float *)(uVar31 + 0x20 + uVar35);
          auVar72._0_4_ = fVar39 * *pfVar2 + *pfVar1;
          auVar72._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
          auVar72._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
          auVar72._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
          auVar61._0_4_ = auVar100._0_4_ * auVar48._0_4_;
          auVar61._4_4_ = auVar100._4_4_ * auVar48._4_4_;
          auVar61._8_4_ = auVar100._8_4_ * auVar48._8_4_;
          auVar61._12_4_ = auVar100._12_4_ * auVar48._12_4_;
          auVar48 = vsubps_avx(auVar72,auVar90._0_16_);
          auVar73._0_4_ = auVar101._0_4_ * auVar48._0_4_;
          auVar73._4_4_ = auVar101._4_4_ * auVar48._4_4_;
          auVar73._8_4_ = auVar101._8_4_ * auVar48._8_4_;
          auVar73._12_4_ = auVar101._12_4_ * auVar48._12_4_;
          auVar48 = vmaxps_avx(auVar61,auVar73);
          pfVar2 = (float *)(uVar31 + 0x80 + uVar37);
          pfVar1 = (float *)(uVar31 + 0x20 + uVar37);
          auVar74._0_4_ = fVar39 * *pfVar2 + *pfVar1;
          auVar74._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
          auVar74._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
          auVar74._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
          auVar41 = vmaxps_avx(auVar41,auVar48);
          auVar48 = vsubps_avx(auVar74,auVar85._0_16_);
          auVar62._0_4_ = auVar95._0_4_ * auVar48._0_4_;
          auVar62._4_4_ = auVar95._4_4_ * auVar48._4_4_;
          auVar62._8_4_ = auVar95._8_4_ * auVar48._8_4_;
          auVar62._12_4_ = auVar95._12_4_ * auVar48._12_4_;
          auVar48 = vminps_avx(auVar105._0_16_,auVar62);
          pfVar2 = (float *)(uVar31 + 0x80 + (uVar36 ^ 0x10));
          pfVar1 = (float *)(uVar31 + 0x20 + (uVar36 ^ 0x10));
          auVar75._0_4_ = fVar39 * *pfVar2 + *pfVar1;
          auVar75._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
          auVar75._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
          auVar75._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
          auVar80 = vsubps_avx(auVar75,auVar87._0_16_);
          auVar76._0_4_ = auVar100._0_4_ * auVar80._0_4_;
          auVar76._4_4_ = auVar100._4_4_ * auVar80._4_4_;
          auVar76._8_4_ = auVar100._8_4_ * auVar80._8_4_;
          auVar76._12_4_ = auVar100._12_4_ * auVar80._12_4_;
          pfVar2 = (float *)(uVar31 + 0x80 + (uVar35 ^ 0x10));
          pfVar1 = (float *)(uVar31 + 0x20 + (uVar35 ^ 0x10));
          auVar77._0_4_ = fVar39 * *pfVar2 + *pfVar1;
          auVar77._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
          auVar77._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
          auVar77._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
          auVar80 = vsubps_avx(auVar77,auVar90._0_16_);
          auVar78._0_4_ = auVar101._0_4_ * auVar80._0_4_;
          auVar78._4_4_ = auVar101._4_4_ * auVar80._4_4_;
          auVar78._8_4_ = auVar101._8_4_ * auVar80._8_4_;
          auVar78._12_4_ = auVar101._12_4_ * auVar80._12_4_;
          auVar80 = vminps_avx(auVar76,auVar78);
          auVar48 = vminps_avx(auVar48,auVar80);
          if (((uint)uVar38 & 7) == 6) {
            auVar48 = vcmpps_avx(auVar41,auVar48,2);
            auVar41 = vcmpps_avx(*(undefined1 (*) [16])(uVar31 + 0xe0),auVar40,2);
            auVar80 = vcmpps_avx(auVar40,*(undefined1 (*) [16])(uVar31 + 0xf0),1);
            auVar41 = vandps_avx(auVar41,auVar80);
            auVar41 = vandps_avx(auVar41,auVar48);
          }
          else {
            auVar41 = vcmpps_avx(auVar41,auVar48,2);
          }
          auVar41 = vpslld_avx(auVar41,0x1f);
          uVar32 = vmovmskps_avx(auVar41);
          if (uVar32 == 0) {
            if (local_990 == &local_7d8) {
              return;
            }
            goto LAB_002c03d8;
          }
          uVar32 = uVar32 & 0xff;
          lVar34 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
            }
          }
          uVar38 = *(ulong *)(uVar31 + lVar34 * 8);
          uVar32 = uVar32 - 1 & uVar32;
          if (uVar32 != 0) {
            *local_990 = uVar38;
            local_990 = local_990 + 1;
            lVar34 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
              }
            }
            uVar38 = *(ulong *)(uVar31 + lVar34 * 8);
            uVar32 = uVar32 - 1 & uVar32;
            uVar33 = (ulong)uVar32;
            if (uVar32 != 0) {
              do {
                *local_990 = uVar38;
                local_990 = local_990 + 1;
                lVar34 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                  }
                }
                uVar38 = *(ulong *)(uVar31 + lVar34 * 8);
                uVar33 = uVar33 & uVar33 - 1;
              } while (uVar33 != 0);
            }
          }
        }
        local_9a0 = (ulong)((uint)uVar38 & 0xf) - 8;
        if (local_9a0 != 0) {
          uVar38 = uVar38 & 0xfffffffffffffff0;
          local_9a8 = 0;
          do {
            lVar34 = local_9a8 * 0x140;
            fVar39 = (ray->dir).field_0.m128[3];
            pfVar2 = (float *)(uVar38 + 0x90 + lVar34);
            pfVar1 = (float *)(uVar38 + lVar34);
            auVar82._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar82._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
            auVar82._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
            auVar82._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar38 + 0xa0 + lVar34);
            pfVar1 = (float *)(uVar38 + 0x10 + lVar34);
            auVar84._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar84._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
            auVar84._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
            auVar84._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar38 + 0xb0 + lVar34);
            pfVar1 = (float *)(uVar38 + 0x20 + lVar34);
            auVar86._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar86._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
            auVar86._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
            auVar86._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar38 + 0xc0 + lVar34);
            pfVar1 = (float *)(uVar38 + 0x30 + lVar34);
            auVar50._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar50._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
            auVar50._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
            auVar50._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar38 + 0xd0 + lVar34);
            pfVar1 = (float *)(uVar38 + 0x40 + lVar34);
            auVar63._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar63._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
            auVar63._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
            auVar63._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar38 + 0xe0 + lVar34);
            pfVar1 = (float *)(uVar38 + 0x50 + lVar34);
            auVar89._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar89._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
            auVar89._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
            auVar89._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar38 + 0xf0 + lVar34);
            pfVar1 = (float *)(uVar38 + 0x60 + lVar34);
            auVar94._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar94._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
            auVar94._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
            auVar94._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar38 + 0x100 + lVar34);
            pfVar1 = (float *)(uVar38 + 0x70 + lVar34);
            auVar99._0_4_ = fVar39 * *pfVar2 + *pfVar1;
            auVar99._4_4_ = fVar39 * pfVar2[1] + pfVar1[1];
            auVar99._8_4_ = fVar39 * pfVar2[2] + pfVar1[2];
            auVar99._12_4_ = fVar39 * pfVar2[3] + pfVar1[3];
            pfVar1 = (float *)(uVar38 + 0x110 + lVar34);
            pfVar2 = (float *)(uVar38 + 0x80 + lVar34);
            auVar42._0_4_ = fVar39 * *pfVar1 + *pfVar2;
            auVar42._4_4_ = fVar39 * pfVar1[1] + pfVar2[1];
            auVar42._8_4_ = fVar39 * pfVar1[2] + pfVar2[2];
            auVar42._12_4_ = fVar39 * pfVar1[3] + pfVar2[3];
            local_9c8 = vsubps_avx(auVar82,auVar50);
            local_a08 = vsubps_avx(auVar84,auVar63);
            auVar41 = vsubps_avx(auVar86,auVar89);
            auVar48 = vsubps_avx(auVar94,auVar82);
            auVar80 = vsubps_avx(auVar99,auVar84);
            auVar70 = vsubps_avx(auVar42,auVar86);
            fVar47 = auVar70._0_4_;
            fVar102 = local_a08._0_4_;
            auVar43._0_4_ = fVar102 * fVar47;
            fVar10 = auVar70._4_4_;
            fVar106 = local_a08._4_4_;
            auVar43._4_4_ = fVar106 * fVar10;
            fVar17 = auVar70._8_4_;
            fVar107 = local_a08._8_4_;
            auVar43._8_4_ = fVar107 * fVar17;
            fVar24 = auVar70._12_4_;
            fVar108 = local_a08._12_4_;
            auVar43._12_4_ = fVar108 * fVar24;
            fVar79 = auVar80._0_4_;
            fVar88 = auVar41._0_4_;
            auVar51._0_4_ = fVar88 * fVar79;
            fVar11 = auVar80._4_4_;
            fVar91 = auVar41._4_4_;
            auVar51._4_4_ = fVar91 * fVar11;
            fVar18 = auVar80._8_4_;
            fVar92 = auVar41._8_4_;
            auVar51._8_4_ = fVar92 * fVar18;
            fVar25 = auVar80._12_4_;
            fVar93 = auVar41._12_4_;
            auVar51._12_4_ = fVar93 * fVar25;
            local_9d8 = vsubps_avx(auVar51,auVar43);
            fVar5 = auVar48._0_4_;
            auVar52._0_4_ = fVar88 * fVar5;
            fVar12 = auVar48._4_4_;
            auVar52._4_4_ = fVar91 * fVar12;
            fVar19 = auVar48._8_4_;
            auVar52._8_4_ = fVar92 * fVar19;
            fVar26 = auVar48._12_4_;
            auVar52._12_4_ = fVar93 * fVar26;
            fVar6 = local_9c8._0_4_;
            auVar64._0_4_ = fVar47 * fVar6;
            fVar13 = local_9c8._4_4_;
            auVar64._4_4_ = fVar10 * fVar13;
            fVar20 = local_9c8._8_4_;
            auVar64._8_4_ = fVar17 * fVar20;
            fVar27 = local_9c8._12_4_;
            auVar64._12_4_ = fVar24 * fVar27;
            local_7f8 = vsubps_avx(auVar64,auVar52);
            auVar65._0_4_ = fVar79 * fVar6;
            auVar65._4_4_ = fVar11 * fVar13;
            auVar65._8_4_ = fVar18 * fVar20;
            auVar65._12_4_ = fVar25 * fVar27;
            auVar103._0_4_ = fVar102 * fVar5;
            auVar103._4_4_ = fVar106 * fVar12;
            auVar103._8_4_ = fVar107 * fVar19;
            auVar103._12_4_ = fVar108 * fVar26;
            auVar80 = vsubps_avx(auVar103,auVar65);
            uVar3 = *(undefined4 *)&(ray->org).field_0;
            auVar104._4_4_ = uVar3;
            auVar104._0_4_ = uVar3;
            auVar104._8_4_ = uVar3;
            auVar104._12_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar109._4_4_ = uVar3;
            auVar109._0_4_ = uVar3;
            auVar109._8_4_ = uVar3;
            auVar109._12_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar111._4_4_ = uVar3;
            auVar111._0_4_ = uVar3;
            auVar111._8_4_ = uVar3;
            auVar111._12_4_ = uVar3;
            fVar39 = (ray->dir).field_0.m128[1];
            auVar41 = vsubps_avx(auVar82,auVar104);
            fVar45 = (ray->dir).field_0.m128[2];
            auVar48 = vsubps_avx(auVar84,auVar109);
            auVar70 = vsubps_avx(auVar86,auVar111);
            fVar7 = auVar70._0_4_;
            auVar110._0_4_ = fVar39 * fVar7;
            fVar14 = auVar70._4_4_;
            auVar110._4_4_ = fVar39 * fVar14;
            fVar21 = auVar70._8_4_;
            auVar110._8_4_ = fVar39 * fVar21;
            fVar28 = auVar70._12_4_;
            auVar110._12_4_ = fVar39 * fVar28;
            fVar8 = auVar48._0_4_;
            auVar112._0_4_ = fVar45 * fVar8;
            fVar15 = auVar48._4_4_;
            auVar112._4_4_ = fVar45 * fVar15;
            fVar22 = auVar48._8_4_;
            auVar112._8_4_ = fVar45 * fVar22;
            fVar29 = auVar48._12_4_;
            auVar112._12_4_ = fVar45 * fVar29;
            auVar48 = vsubps_avx(auVar112,auVar110);
            fVar46 = (ray->dir).field_0.m128[0];
            fVar9 = auVar41._0_4_;
            auVar44._0_4_ = fVar45 * fVar9;
            fVar16 = auVar41._4_4_;
            auVar44._4_4_ = fVar45 * fVar16;
            fVar23 = auVar41._8_4_;
            auVar44._8_4_ = fVar45 * fVar23;
            fVar30 = auVar41._12_4_;
            auVar44._12_4_ = fVar45 * fVar30;
            auVar53._0_4_ = fVar46 * fVar7;
            auVar53._4_4_ = fVar46 * fVar14;
            auVar53._8_4_ = fVar46 * fVar21;
            auVar53._12_4_ = fVar46 * fVar28;
            auVar70 = vsubps_avx(auVar53,auVar44);
            auVar54._0_4_ = fVar46 * fVar8;
            auVar54._4_4_ = fVar46 * fVar15;
            auVar54._8_4_ = fVar46 * fVar22;
            auVar54._12_4_ = fVar46 * fVar29;
            auVar66._0_4_ = fVar39 * fVar9;
            auVar66._4_4_ = fVar39 * fVar16;
            auVar66._8_4_ = fVar39 * fVar23;
            auVar66._12_4_ = fVar39 * fVar30;
            auVar71 = vsubps_avx(auVar66,auVar54);
            auVar67._0_4_ =
                 fVar46 * local_9d8._0_4_ + fVar39 * local_7f8._0_4_ + fVar45 * auVar80._0_4_;
            auVar67._4_4_ =
                 fVar46 * local_9d8._4_4_ + fVar39 * local_7f8._4_4_ + fVar45 * auVar80._4_4_;
            auVar67._8_4_ =
                 fVar46 * local_9d8._8_4_ + fVar39 * local_7f8._8_4_ + fVar45 * auVar80._8_4_;
            auVar67._12_4_ =
                 fVar46 * local_9d8._12_4_ + fVar39 * local_7f8._12_4_ + fVar45 * auVar80._12_4_;
            auVar55._8_8_ = 0x8000000080000000;
            auVar55._0_8_ = 0x8000000080000000;
            auVar41 = vandps_avx(auVar67,auVar55);
            uVar32 = auVar41._0_4_;
            local_898._0_4_ =
                 (float)(uVar32 ^ (uint)(fVar5 * auVar48._0_4_ +
                                        fVar79 * auVar70._0_4_ + fVar47 * auVar71._0_4_));
            uVar96 = auVar41._4_4_;
            local_898._4_4_ =
                 (float)(uVar96 ^ (uint)(fVar12 * auVar48._4_4_ +
                                        fVar11 * auVar70._4_4_ + fVar10 * auVar71._4_4_));
            uVar97 = auVar41._8_4_;
            local_898._8_4_ =
                 (float)(uVar97 ^ (uint)(fVar19 * auVar48._8_4_ +
                                        fVar18 * auVar70._8_4_ + fVar17 * auVar71._8_4_));
            uVar98 = auVar41._12_4_;
            local_898._12_4_ =
                 (float)(uVar98 ^ (uint)(fVar26 * auVar48._12_4_ +
                                        fVar25 * auVar70._12_4_ + fVar24 * auVar71._12_4_));
            local_888._0_4_ =
                 (float)(uVar32 ^ (uint)(auVar48._0_4_ * fVar6 +
                                        auVar70._0_4_ * fVar102 + fVar88 * auVar71._0_4_));
            local_888._4_4_ =
                 (float)(uVar96 ^ (uint)(auVar48._4_4_ * fVar13 +
                                        auVar70._4_4_ * fVar106 + fVar91 * auVar71._4_4_));
            local_888._8_4_ =
                 (float)(uVar97 ^ (uint)(auVar48._8_4_ * fVar20 +
                                        auVar70._8_4_ * fVar107 + fVar92 * auVar71._8_4_));
            local_888._12_4_ =
                 (float)(uVar98 ^ (uint)(auVar48._12_4_ * fVar27 +
                                        auVar70._12_4_ * fVar108 + fVar93 * auVar71._12_4_));
            auVar70 = ZEXT416(0) << 0x20;
            auVar41 = vcmpps_avx(local_898,auVar70,5);
            auVar48 = vcmpps_avx(local_888,auVar70,5);
            auVar41 = vandps_avx(auVar41,auVar48);
            auVar56._8_4_ = 0x7fffffff;
            auVar56._0_8_ = 0x7fffffff7fffffff;
            auVar56._12_4_ = 0x7fffffff;
            local_868 = vandps_avx(auVar67,auVar56);
            auVar48 = vcmpps_avx(auVar70,auVar67,4);
            auVar41 = vandps_avx(auVar41,auVar48);
            auVar57._0_4_ = local_898._0_4_ + local_888._0_4_;
            auVar57._4_4_ = local_898._4_4_ + local_888._4_4_;
            auVar57._8_4_ = local_898._8_4_ + local_888._8_4_;
            auVar57._12_4_ = local_898._12_4_ + local_888._12_4_;
            auVar48 = vcmpps_avx(auVar57,local_868,2);
            auVar41 = vandps_avx(auVar41,auVar48);
            auVar48 = local_928 & auVar41;
            if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar48[0xf] < '\0') {
              auVar41 = vandps_avx(auVar41,local_928);
              local_878._0_4_ =
                   (float)(uVar32 ^ (uint)(local_9d8._0_4_ * fVar9 +
                                          local_7f8._0_4_ * fVar8 + fVar7 * auVar80._0_4_));
              local_878._4_4_ =
                   (float)(uVar96 ^ (uint)(local_9d8._4_4_ * fVar16 +
                                          local_7f8._4_4_ * fVar15 + fVar14 * auVar80._4_4_));
              local_878._8_4_ =
                   (float)(uVar97 ^ (uint)(local_9d8._8_4_ * fVar23 +
                                          local_7f8._8_4_ * fVar22 + fVar21 * auVar80._8_4_));
              local_878._12_4_ =
                   (float)(uVar98 ^ (uint)(local_9d8._12_4_ * fVar30 +
                                          local_7f8._12_4_ * fVar29 + fVar28 * auVar80._12_4_));
              fVar39 = (ray->org).field_0.m128[3];
              fVar45 = local_868._0_4_;
              auVar58._0_4_ = fVar45 * fVar39;
              fVar46 = local_868._4_4_;
              auVar58._4_4_ = fVar46 * fVar39;
              fVar47 = local_868._8_4_;
              auVar58._8_4_ = fVar47 * fVar39;
              fVar79 = local_868._12_4_;
              auVar58._12_4_ = fVar79 * fVar39;
              auVar48 = vcmpps_avx(auVar58,local_878,1);
              fVar39 = ray->tfar;
              auVar68._0_4_ = fVar45 * fVar39;
              auVar68._4_4_ = fVar46 * fVar39;
              auVar68._8_4_ = fVar47 * fVar39;
              auVar68._12_4_ = fVar79 * fVar39;
              auVar70 = vcmpps_avx(local_878,auVar68,2);
              auVar48 = vandps_avx(auVar70,auVar48);
              local_848 = vandps_avx(auVar48,auVar41);
              uVar32 = vmovmskps_avx(local_848);
              if (uVar32 != 0) {
                local_808 = local_9d8;
                local_a28 = auVar80._0_8_;
                uStack_a20 = auVar80._8_8_;
                local_7e8 = local_a28;
                uStack_7e0 = uStack_a20;
                local_9c8._0_8_ = local_9e0->scene;
                auVar41 = vrcpps_avx(local_868);
                fVar39 = auVar41._0_4_;
                auVar59._0_4_ = fVar45 * fVar39;
                fVar45 = auVar41._4_4_;
                auVar59._4_4_ = fVar46 * fVar45;
                fVar46 = auVar41._8_4_;
                auVar59._8_4_ = fVar47 * fVar46;
                fVar47 = auVar41._12_4_;
                auVar59._12_4_ = fVar79 * fVar47;
                auVar69._8_4_ = 0x3f800000;
                auVar69._0_8_ = 0x3f8000003f800000;
                auVar69._12_4_ = 0x3f800000;
                auVar41 = vsubps_avx(auVar69,auVar59);
                fVar39 = fVar39 + fVar39 * auVar41._0_4_;
                fVar45 = fVar45 + fVar45 * auVar41._4_4_;
                fVar46 = fVar46 + fVar46 * auVar41._8_4_;
                fVar47 = fVar47 + fVar47 * auVar41._12_4_;
                local_818[0] = fVar39 * local_878._0_4_;
                local_818[1] = fVar45 * local_878._4_4_;
                local_818[2] = fVar46 * local_878._8_4_;
                local_818[3] = fVar47 * local_878._12_4_;
                local_838._0_4_ = fVar39 * local_898._0_4_;
                local_838._4_4_ = fVar45 * local_898._4_4_;
                local_838._8_4_ = fVar46 * local_898._8_4_;
                local_838._12_4_ = fVar47 * local_898._12_4_;
                local_828._0_4_ = fVar39 * local_888._0_4_;
                local_828._4_4_ = fVar45 * local_888._4_4_;
                local_828._8_4_ = fVar46 * local_888._8_4_;
                local_828._12_4_ = fVar47 * local_888._12_4_;
                uVar31 = (ulong)(uVar32 & 0xff);
                local_9e8 = lVar34 + uVar38;
                do {
                  local_9d8._0_8_ = uVar31;
                  uVar33 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                    }
                  }
                  local_a08._0_8_ = uVar33;
                  local_970 = *(uint *)(local_9e8 + 0x120 + uVar33 * 4);
                  local_9b0 = *(long *)(*(long *)(local_9c8._0_8_ + 0x1e8) + (ulong)local_970 * 8);
                  if ((*(uint *)(local_9b0 + 0x34) & ray->mask) == 0) {
                    uVar31 = uVar31 ^ 1L << (uVar33 & 0x3f);
                  }
                  else {
                    if ((local_9e0->args->filter == (RTCFilterFunctionN)0x0) &&
                       (*(long *)(local_9b0 + 0x48) == 0)) {
LAB_002c0b60:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    local_9f0 = local_9e0->args;
                    local_958.context = local_9e0->user;
                    local_988 = *(undefined4 *)(local_808 + uVar33 * 4);
                    local_984 = *(undefined4 *)(local_7f8 + uVar33 * 4);
                    local_980 = *(undefined4 *)((long)&local_7e8 + uVar33 * 4);
                    local_97c = *(undefined4 *)(local_838 + uVar33 * 4);
                    local_978 = *(undefined4 *)(local_828 + uVar33 * 4);
                    local_974 = *(undefined4 *)(local_9e8 + 0x130 + uVar33 * 4);
                    local_96c = (local_958.context)->instID[0];
                    local_968 = (local_958.context)->instPrimID[0];
                    fVar39 = ray->tfar;
                    ray->tfar = local_818[uVar33];
                    local_a0c = -1;
                    local_958.valid = &local_a0c;
                    local_958.geometryUserPtr = *(void **)(local_9b0 + 0x18);
                    local_958.hit = (RTCHitN *)&local_988;
                    local_958.N = 1;
                    local_958.ray = (RTCRayN *)ray;
                    if (((*(code **)(local_9b0 + 0x48) == (code *)0x0) ||
                        ((**(code **)(local_9b0 + 0x48))(&local_958), *local_958.valid != 0)) &&
                       ((local_9f0->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_9f0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_9b0 + 0x3e) & 0x40) == 0)) ||
                         ((*local_9f0->filter)(&local_958), *local_958.valid != 0))))))
                    goto LAB_002c0b60;
                    ray->tfar = fVar39;
                    uVar31 = local_9d8._0_8_ ^ 1L << (local_a08._0_8_ & 0x3f);
                  }
                } while (uVar31 != 0);
              }
            }
            local_9a8 = local_9a8 + 1;
          } while (local_9a8 != local_9a0);
        }
        auVar85 = ZEXT1664(local_8a8);
        auVar87 = ZEXT1664(local_8b8);
        auVar90 = ZEXT1664(local_8c8);
        auVar95 = ZEXT1664(local_8d8);
        auVar100 = ZEXT1664(local_8e8);
        auVar101 = ZEXT1664(local_8f8);
        auVar83 = ZEXT1664(local_908);
        auVar105 = ZEXT1664(local_918);
      } while (local_990 != &local_7d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }